

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

uint aom_highbd_sad64x32_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  uint uVar1;
  int row_section;
  int left_shift;
  uint16_t *secp;
  uint16_t *refp;
  uint16_t *srcp;
  __m256i sad;
  __m256i *in_stack_00000048;
  uint16_t *in_stack_00000050;
  undefined4 in_stack_00000060;
  undefined4 in_stack_00000070;
  undefined4 local_e0;
  __m256i *in_stack_ffffffffffffff70;
  
  for (local_e0 = 0; local_e0 < 0x10; local_e0 = local_e0 + 1) {
    sad64x2((uint16_t *)CONCAT44(src_stride,in_stack_00000070),ref._4_4_,
            (uint16_t *)CONCAT44(ref_stride,in_stack_00000060),second_pred._4_4_,in_stack_00000050,
            in_stack_00000048);
  }
  uVar1 = get_sad_from_mm256_epi32(in_stack_ffffffffffffff70);
  return uVar1;
}

Assistant:

unsigned int aom_highbd_sad64x32_avg_avx2(const uint8_t *src, int src_stride,
                                          const uint8_t *ref, int ref_stride,
                                          const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);
  const int left_shift = 1;
  int row_section = 0;

  while (row_section < 16) {
    sad64x2(srcp, src_stride, refp, ref_stride, secp, &sad);
    srcp += src_stride << left_shift;
    refp += ref_stride << left_shift;
    secp += 64 << left_shift;
    row_section += 1;
  }
  return get_sad_from_mm256_epi32(&sad);
}